

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O2

void __thiscall sf::Shader::setUniform(Shader *this,string *name,Texture *texture)

{
  int iVar1;
  iterator iVar2;
  _Base_ptr *pp_Var3;
  ostream *poVar4;
  ulong uVar5;
  TransientContextLock lock;
  int location;
  int local_34;
  Lock local_30;
  
  if (this->m_shaderProgram == 0) {
    return;
  }
  GlResource::TransientContextLock::TransientContextLock(&lock);
  location = getUniformLocation(this,name);
  if (location != -1) {
    iVar2 = std::
            _Rb_tree<int,_std::pair<const_int,_const_sf::Texture_*>,_std::_Select1st<std::pair<const_int,_const_sf::Texture_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_sf::Texture_*>_>_>
            ::find(&(this->m_textures)._M_t,&location);
    if ((_Rb_tree_header *)iVar2._M_node == &(this->m_textures)._M_t._M_impl.super__Rb_tree_header)
    {
      Lock::Lock(&local_30,(Mutex *)&(anonymous_namespace)::maxTextureUnitsMutex);
      if (((anonymous_namespace)::getMaxTextureUnits()::maxUnits == '\0') &&
         (iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::getMaxTextureUnits()::maxUnits),
         iVar1 != 0)) {
        local_34 = 0;
        glGetIntegerv(0x8b4d);
        priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/sfml-src/src/SFML/Graphics/Shader.cpp"
                           ,0x41,
                           "glGetIntegerv(GLEXT_GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS, &maxUnits)");
        (anonymous_namespace)::getMaxTextureUnits()::maxUnits = local_34;
        __cxa_guard_release(&(anonymous_namespace)::getMaxTextureUnits()::maxUnits);
      }
      uVar5 = (ulong)(anonymous_namespace)::getMaxTextureUnits()::maxUnits;
      Lock::~Lock(&local_30);
      if (uVar5 <= (this->m_textures)._M_t._M_impl.super__Rb_tree_header._M_node_count + 1) {
        poVar4 = err();
        poVar4 = std::operator<<(poVar4,"Impossible to use texture \"");
        poVar4 = std::operator<<(poVar4,(string *)name);
        poVar4 = std::operator<<(poVar4,"\" for shader: all available texture units are used");
        std::endl<char,std::char_traits<char>>(poVar4);
        goto LAB_00132ea1;
      }
      pp_Var3 = (_Base_ptr *)
                std::
                map<int,_const_sf::Texture_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_sf::Texture_*>_>_>
                ::operator[](&this->m_textures,&location);
    }
    else {
      pp_Var3 = &iVar2._M_node[1]._M_parent;
    }
    *pp_Var3 = (_Base_ptr)texture;
  }
LAB_00132ea1:
  GlResource::TransientContextLock::~TransientContextLock(&lock);
  return;
}

Assistant:

void Shader::setUniform(const std::string& name, const Texture& texture)
{
    if (m_shaderProgram)
    {
        TransientContextLock lock;

        // Find the location of the variable in the shader
        int location = getUniformLocation(name);
        if (location != -1)
        {
            // Store the location -> texture mapping
            TextureTable::iterator it = m_textures.find(location);
            if (it == m_textures.end())
            {
                // New entry, make sure there are enough texture units
                GLint maxUnits = getMaxTextureUnits();
                if (m_textures.size() + 1 >= static_cast<std::size_t>(maxUnits))
                {
                    err() << "Impossible to use texture \"" << name << "\" for shader: all available texture units are used" << std::endl;
                    return;
                }

                m_textures[location] = &texture;
            }
            else
            {
                // Location already used, just replace the texture
                it->second = &texture;
            }
        }
    }
}